

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isValidForDPIReturn(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *in_RDI;
  bool local_1;
  
  pTVar2 = getCanonicalType(in_RDI);
  SVar1 = (pTVar2->super_Symbol).kind;
  if (((SVar1 - PredefinedIntegerType < 3) || (SVar1 == VoidType)) ||
     (SVar1 == CHandleType || SVar1 == StringType)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isValidForDPIReturn() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::VoidType:
        case SymbolKind::FloatingType:
        case SymbolKind::CHandleType:
        case SymbolKind::StringType:
        case SymbolKind::ScalarType:
        case SymbolKind::PredefinedIntegerType:
            return true;
        default:
            return false;
    }
}